

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.cpp
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::SymbolMatcher::match
          (SymbolMatcher *this,StringSegment *segment,ParsedNumber *result,UErrorCode *param_3)

{
  UBool UVar1;
  uint uVar2;
  int32_t iVar3;
  int local_34;
  int cp;
  int overlap;
  UErrorCode *param_3_local;
  ParsedNumber *result_local;
  StringSegment *segment_local;
  SymbolMatcher *this_local;
  
  uVar2 = (*(this->super_NumberParseMatcher)._vptr_NumberParseMatcher[7])(this,result);
  if ((uVar2 & 1) == 0) {
    local_34 = 0;
    UVar1 = UnicodeString::isEmpty(&this->fString);
    if (UVar1 == '\0') {
      local_34 = StringSegment::getCommonPrefixLength(segment,&this->fString);
      iVar3 = UnicodeString::length(&this->fString);
      if (local_34 == iVar3) {
        iVar3 = UnicodeString::length(&this->fString);
        StringSegment::adjustOffset(segment,iVar3);
        (*(this->super_NumberParseMatcher)._vptr_NumberParseMatcher[8])(this,segment,result);
        return false;
      }
    }
    uVar2 = StringSegment::getCodePoint(segment);
    if ((uVar2 == 0xffffffff) || (UVar1 = UnicodeSet::contains(this->fUniSet,uVar2), UVar1 == '\0'))
    {
      iVar3 = StringSegment::length(segment);
      this_local._7_1_ = local_34 == iVar3;
    }
    else {
      iVar3 = 2;
      if (uVar2 < 0x10000) {
        iVar3 = 1;
      }
      StringSegment::adjustOffset(segment,iVar3);
      (*(this->super_NumberParseMatcher)._vptr_NumberParseMatcher[8])(this,segment,result);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SymbolMatcher::match(StringSegment& segment, ParsedNumber& result, UErrorCode&) const {
    // Smoke test first; this matcher might be disabled.
    if (isDisabled(result)) {
        return false;
    }

    // Test the string first in order to consume trailing chars greedily.
    int overlap = 0;
    if (!fString.isEmpty()) {
        overlap = segment.getCommonPrefixLength(fString);
        if (overlap == fString.length()) {
            segment.adjustOffset(fString.length());
            accept(segment, result);
            return false;
        }
    }

    int cp = segment.getCodePoint();
    if (cp != -1 && fUniSet->contains(cp)) {
        segment.adjustOffset(U16_LENGTH(cp));
        accept(segment, result);
        return false;
    }

    return overlap == segment.length();
}